

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::BodyExpr::toString_abi_cxx11_(string *__return_storage_ptr__,BodyExpr *this)

{
  ReturnControlType RVar1;
  bool bVar2;
  pointer pEVar3;
  string local_80 [32];
  string local_60 [32];
  reference local_40;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr;
  const_iterator __end1;
  const_iterator __begin1;
  Exprs *__range1;
  BodyExpr *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::begin(&this->exprs);
  expr = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
         std::
         vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::end(&this->exprs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                                     *)&expr), bVar2) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
               ::operator*(&__end1);
    pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (local_40);
    (*pEVar3->_vptr_Expr[2])();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
    ::operator++(&__end1);
  }
  RVar1 = this->rct;
  if (RVar1 == RETURN) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"return");
  }
  else if (RVar1 == CONTINUE) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"continue");
  }
  else if (RVar1 == BREAK) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"break");
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->retExpr);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
    pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (&this->retExpr);
    (*pEVar3->_vptr_Expr[2])();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80);
    std::__cxx11::string::~string(local_80);
  }
  if (this->rct != NONE) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BodyExpr::toString() const noexcept {
  std::string result;
  for (auto &expr : exprs) {
    result += expr->toString();
    result += '\n';
  }

  switch (rct) {
  case ReturnControlType::RETURN:
      result += "return";
      break;
  case ReturnControlType::CONTINUE:
      result += "continue";
      break;
  case ReturnControlType::BREAK:
      result += "break";
      break;
  default:
      break;
  };

  if (retExpr) {
    result += ' ';
    result += retExpr->toString();
  }

  if (rct != ReturnControlType::NONE)
    result += '\n';

  return result;
}